

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgDreamSampleWrapC.cpp
# Opt level: O2

void tsgDreamSample(int form,int num_burnup,int num_collect,tsg_dream_pdf distribution,
                   void *state_pntr,void *domain_grid,double *domain_lower,double *dommain_upper,
                   tsg_dream_domain domain_callback,char *iupdate_type,double iupdate_magnitude,
                   tsg_dream_iupdate iupdate_callback,int dupdate_percent,
                   tsg_dream_dupdate dupdate_callback,char *random_type,int random_seed,
                   tsg_dream_random random_callback,int *err)

{
  function<double_()> differential_update;
  function<double_()> differential_update_00;
  function<double_()> differential_update_01;
  function<double_()> differential_update_02;
  function<double_()> get_random01;
  function<double_()> get_random01_00;
  function<double_()> get_random01_01;
  function<double_()> get_random01_02;
  int iVar1;
  char *__s;
  bool bVar2;
  TypeDistribution dist;
  uint __seed;
  unsigned_long __res;
  code *pcVar3;
  ulong uVar4;
  code *pcVar6;
  _Any_data *independent_update;
  function<bool_(const_std::vector<double,_std::allocator<double>_>_&)> *this;
  function<double_()> *this_00;
  _Any_data *probability_distribution;
  function<double_()> *this_01;
  undefined1 in_stack_fffffffffffffcc8 [12];
  int num_dimensions;
  tsg_dream_pdf distribution_local;
  function<double_()> randgen;
  function<double_()> diff_update;
  minstd_rand park_miller;
  _Any_data local_2c8;
  code *local_2b8;
  code *local_2b0;
  _Any_data local_2a8;
  code *local_298;
  code *local_290;
  _Any_data local_288;
  code *local_278;
  code *local_270;
  _Any_data local_268;
  code *local_258;
  code *local_250;
  function<bool_(const_std::vector<double,_std::allocator<double>_>_&)> domain;
  _Any_data local_228;
  code *local_218;
  code *local_210;
  _Any_data local_208;
  code *local_1f8;
  code *local_1f0;
  string rtype;
  undefined4 local_1c8;
  undefined4 uStack_1c4;
  undefined4 uStack_1c0;
  undefined4 uStack_1bc;
  function<double_()> local_1b0;
  _Any_data local_190 [2];
  function<bool_(const_std::vector<double,_std::allocator<double>_>_&)> local_170;
  function<double_()> local_150;
  _Any_data local_130 [2];
  function<bool_(const_std::vector<double,_std::allocator<double>_>_&)> local_110;
  function<double_()> local_f0;
  function<double_()> local_d0;
  function<bool_(const_std::vector<double,_std::allocator<double>_>_&)> local_b0;
  function<double_()> local_90;
  function<double_()> local_70;
  function<bool_(const_std::vector<double,_std::allocator<double>_>_&)> local_50;
  time_t tVar5;
  
  *err = 1;
  num_dimensions = *(int *)((long)state_pntr + 8);
  distribution_local = distribution;
  TasDREAM::getSpecifiedDomain
            (&domain,num_dimensions,domain_grid,domain_lower,dommain_upper,domain_callback);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&diff_update,iupdate_type,(allocator<char> *)&rtype);
  dist = TasDREAM::IO::getDistributionString((string *)&diff_update);
  __seed = random_seed;
  iVar1 = dupdate_percent;
  std::__cxx11::string::~string((string *)&diff_update);
  if (iVar1 < 0) {
    diff_update.super__Function_base._M_functor._M_unused._M_function_pointer =
         (_func_void *)dupdate_callback;
    pcVar3 = std::
             _Function_handler<double_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/DREAM/tsgDreamSampleWrapC.cpp:64:16)>
             ::_M_manager;
    pcVar6 = std::
             _Function_handler<double_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/DREAM/tsgDreamSampleWrapC.cpp:64:16)>
             ::_M_invoke;
  }
  else {
    diff_update.super__Function_base._M_functor._4_4_ = 0;
    diff_update.super__Function_base._M_functor._0_4_ = iVar1;
    pcVar3 = std::
             _Function_handler<double_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/DREAM/tsgDreamSampleWrapC.cpp:62:16)>
             ::_M_manager;
    pcVar6 = std::
             _Function_handler<double_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/DREAM/tsgDreamSampleWrapC.cpp:62:16)>
             ::_M_invoke;
  }
  diff_update.super__Function_base._M_functor._8_8_ = 0;
  diff_update.super__Function_base._M_manager = pcVar3;
  diff_update._M_invoker = pcVar6;
  if (__seed == -1) {
    uVar4 = time((time_t *)0x0);
  }
  else {
    uVar4 = (ulong)(int)__seed;
  }
  __s = random_type;
  park_miller._M_x = uVar4 % 0x7fffffff + (ulong)(uVar4 % 0x7fffffff == 0);
  local_1c8 = 0;
  uStack_1c4 = 0;
  uStack_1c0 = 0;
  uStack_1bc = 0x3ff00000;
  if (__seed == -1) {
    tVar5 = time((time_t *)0x0);
    __seed = (uint)tVar5;
  }
  srand(__seed);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&rtype,__s,(allocator<char> *)&randgen);
  bVar2 = std::operator==(&rtype,"default");
  if (bVar2) {
    randgen.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
    randgen.super__Function_base._M_functor._8_8_ = 0;
    randgen._M_invoker =
         std::
         _Function_handler<double_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/DREAM/tsgDreamSampleWrapC.cpp:148:20)>
         ::_M_invoke;
    pcVar3 = std::
             _Function_handler<double_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/DREAM/tsgDreamSampleWrapC.cpp:148:20)>
             ::_M_manager;
  }
  else {
    bVar2 = std::operator==(&rtype,"minstd_rand");
    if (bVar2) {
      randgen.super__Function_base._M_functor._M_unused._M_object = &local_1c8;
      randgen.super__Function_base._M_functor._8_8_ = &park_miller;
      randgen._M_invoker =
           std::
           _Function_handler<double_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/DREAM/tsgDreamSampleWrapC.cpp:150:20)>
           ::_M_invoke;
      pcVar3 = std::
               _Function_handler<double_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/DREAM/tsgDreamSampleWrapC.cpp:150:20)>
               ::_M_manager;
    }
    else {
      randgen.super__Function_base._M_functor._8_8_ = 0;
      randgen.super__Function_base._M_functor._M_unused._M_object = &random_callback;
      randgen._M_invoker =
           std::
           _Function_handler<double_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/DREAM/tsgDreamSampleWrapC.cpp:152:20)>
           ::_M_invoke;
      pcVar3 = std::
               _Function_handler<double_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/DREAM/tsgDreamSampleWrapC.cpp:152:20)>
               ::_M_manager;
    }
  }
  randgen.super__Function_base._M_manager = pcVar3;
  if (dist == dist_null) {
    if (form == 0) {
      local_268._8_8_ = &distribution_local;
      local_250 = std::
                  _Function_handler<void_(const_std::vector<double,_std::allocator<double>_>_&,_std::vector<double,_std::allocator<double>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/DREAM/tsgDreamSampleWrapC.cpp:159:63)>
                  ::_M_invoke;
      local_258 = std::
                  _Function_handler<void_(const_std::vector<double,_std::allocator<double>_>_&,_std::vector<double,_std::allocator<double>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/DREAM/tsgDreamSampleWrapC.cpp:159:63)>
                  ::_M_manager;
      this = &local_50;
      local_268._M_unused._M_object = &num_dimensions;
      std::function<bool_(const_std::vector<double,_std::allocator<double>_>_&)>::function
                (this,&domain);
      local_208._8_8_ = 0;
      local_208._M_unused._M_object = &iupdate_callback;
      local_1f0 = std::
                  _Function_handler<void_(std::vector<double,_std::allocator<double>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/DREAM/tsgDreamSampleWrapC.cpp:165:35)>
                  ::_M_invoke;
      local_1f8 = std::
                  _Function_handler<void_(std::vector<double,_std::allocator<double>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/DREAM/tsgDreamSampleWrapC.cpp:165:35)>
                  ::_M_manager;
      this_00 = &local_70;
      std::function<double_()>::function(this_00,&diff_update);
      this_01 = &local_90;
      std::function<double_()>::function(this_01,&randgen);
      probability_distribution = &local_268;
      independent_update = &local_208;
      differential_update_01.super__Function_base._M_functor._8_8_ = this_01;
      differential_update_01.super__Function_base._M_functor._M_unused._M_object = this_00;
      differential_update_01._16_12_ = in_stack_fffffffffffffcc8;
      differential_update_01._M_invoker._4_4_ = num_collect;
      get_random01_01.super__Function_base._M_functor._4_4_ = num_dimensions;
      get_random01_01.super__Function_base._M_functor._0_4_ = num_burnup;
      get_random01_01.super__Function_base._M_functor._8_8_ = distribution_local;
      get_random01_01.super__Function_base._M_manager =
           (_Manager_type)randgen.super__Function_base._M_functor._M_unused._0_8_;
      get_random01_01._M_invoker = (_Invoker_type)randgen.super__Function_base._M_functor._8_8_;
      TasDREAM::SampleDREAM<(TasDREAM::TypeSamplingForm)0>
                (num_burnup,num_collect,(DreamPDF *)probability_distribution,this,
                 (TasmanianDREAM *)state_pntr,
                 (function<void_(std::vector<double,_std::allocator<double>_>_&)> *)
                 independent_update,differential_update_01,get_random01_01);
    }
    else {
      local_288._8_8_ = &distribution_local;
      local_270 = std::
                  _Function_handler<void_(const_std::vector<double,_std::allocator<double>_>_&,_std::vector<double,_std::allocator<double>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/DREAM/tsgDreamSampleWrapC.cpp:172:63)>
                  ::_M_invoke;
      local_278 = std::
                  _Function_handler<void_(const_std::vector<double,_std::allocator<double>_>_&,_std::vector<double,_std::allocator<double>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/DREAM/tsgDreamSampleWrapC.cpp:172:63)>
                  ::_M_manager;
      this = &local_b0;
      local_288._M_unused._M_object = &num_dimensions;
      std::function<bool_(const_std::vector<double,_std::allocator<double>_>_&)>::function
                (this,&domain);
      local_228._8_8_ = 0;
      local_228._M_unused._M_object = &iupdate_callback;
      local_210 = std::
                  _Function_handler<void_(std::vector<double,_std::allocator<double>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/DREAM/tsgDreamSampleWrapC.cpp:178:35)>
                  ::_M_invoke;
      local_218 = std::
                  _Function_handler<void_(std::vector<double,_std::allocator<double>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/DREAM/tsgDreamSampleWrapC.cpp:178:35)>
                  ::_M_manager;
      this_00 = &local_d0;
      std::function<double_()>::function(this_00,&diff_update);
      this_01 = &local_f0;
      std::function<double_()>::function(this_01,&randgen);
      probability_distribution = &local_288;
      independent_update = &local_228;
      differential_update.super__Function_base._M_functor._8_8_ = this_01;
      differential_update.super__Function_base._M_functor._M_unused._M_object = this_00;
      differential_update._16_12_ = in_stack_fffffffffffffcc8;
      differential_update._M_invoker._4_4_ = num_collect;
      get_random01.super__Function_base._M_functor._4_4_ = num_dimensions;
      get_random01.super__Function_base._M_functor._0_4_ = num_burnup;
      get_random01.super__Function_base._M_functor._8_8_ = distribution_local;
      get_random01.super__Function_base._M_manager =
           (_Manager_type)randgen.super__Function_base._M_functor._M_unused._0_8_;
      get_random01._M_invoker = (_Invoker_type)randgen.super__Function_base._M_functor._8_8_;
      TasDREAM::SampleDREAM<(TasDREAM::TypeSamplingForm)1>
                (num_burnup,num_collect,(DreamPDF *)probability_distribution,this,
                 (TasmanianDREAM *)state_pntr,
                 (function<void_(std::vector<double,_std::allocator<double>_>_&)> *)
                 independent_update,differential_update,get_random01);
    }
    std::_Function_base::~_Function_base(&this_01->super__Function_base);
  }
  else if (form == 0) {
    local_2a8._8_8_ = &distribution_local;
    local_290 = std::
                _Function_handler<void_(const_std::vector<double,_std::allocator<double>_>_&,_std::vector<double,_std::allocator<double>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/DREAM/tsgDreamSampleWrapC.cpp:187:63)>
                ::_M_invoke;
    local_298 = std::
                _Function_handler<void_(const_std::vector<double,_std::allocator<double>_>_&,_std::vector<double,_std::allocator<double>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/DREAM/tsgDreamSampleWrapC.cpp:187:63)>
                ::_M_manager;
    this = &local_110;
    local_2a8._M_unused._M_object = &num_dimensions;
    std::function<bool_(const_std::vector<double,_std::allocator<double>_>_&)>::function
              (this,&domain);
    independent_update = local_130;
    std::function<double_()>::function((function<double_()> *)independent_update,&diff_update);
    this_00 = &local_150;
    std::function<double_()>::function(this_00,&randgen);
    probability_distribution = &local_2a8;
    differential_update_02.super__Function_base._M_functor._8_8_ = this_00;
    differential_update_02.super__Function_base._M_functor._M_unused._M_object = independent_update;
    differential_update_02._16_12_ = in_stack_fffffffffffffcc8;
    differential_update_02._M_invoker._4_4_ = num_collect;
    get_random01_02.super__Function_base._M_functor._4_4_ = num_dimensions;
    get_random01_02.super__Function_base._M_functor._0_4_ = num_burnup;
    get_random01_02.super__Function_base._M_functor._8_8_ = distribution_local;
    get_random01_02.super__Function_base._M_manager =
         (_Manager_type)randgen.super__Function_base._M_functor._M_unused._0_8_;
    get_random01_02._M_invoker = (_Invoker_type)randgen.super__Function_base._M_functor._8_8_;
    TasDREAM::SampleDREAM<(TasDREAM::TypeSamplingForm)0>
              (num_burnup,num_collect,(DreamPDF *)probability_distribution,this,
               (TasmanianDREAM *)state_pntr,dist,iupdate_magnitude,differential_update_02,
               get_random01_02);
  }
  else {
    local_2c8._8_8_ = &distribution_local;
    local_2b0 = std::
                _Function_handler<void_(const_std::vector<double,_std::allocator<double>_>_&,_std::vector<double,_std::allocator<double>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/DREAM/tsgDreamSampleWrapC.cpp:195:63)>
                ::_M_invoke;
    local_2b8 = std::
                _Function_handler<void_(const_std::vector<double,_std::allocator<double>_>_&,_std::vector<double,_std::allocator<double>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/DREAM/tsgDreamSampleWrapC.cpp:195:63)>
                ::_M_manager;
    this = &local_170;
    local_2c8._M_unused._M_object = &num_dimensions;
    std::function<bool_(const_std::vector<double,_std::allocator<double>_>_&)>::function
              (this,&domain);
    independent_update = local_190;
    std::function<double_()>::function((function<double_()> *)independent_update,&diff_update);
    this_00 = &local_1b0;
    std::function<double_()>::function(this_00,&randgen);
    probability_distribution = &local_2c8;
    differential_update_00.super__Function_base._M_functor._8_8_ = this_00;
    differential_update_00.super__Function_base._M_functor._M_unused._M_object = independent_update;
    differential_update_00._16_12_ = in_stack_fffffffffffffcc8;
    differential_update_00._M_invoker._4_4_ = num_collect;
    get_random01_00.super__Function_base._M_functor._4_4_ = num_dimensions;
    get_random01_00.super__Function_base._M_functor._0_4_ = num_burnup;
    get_random01_00.super__Function_base._M_functor._8_8_ = distribution_local;
    get_random01_00.super__Function_base._M_manager =
         (_Manager_type)randgen.super__Function_base._M_functor._M_unused._0_8_;
    get_random01_00._M_invoker = (_Invoker_type)randgen.super__Function_base._M_functor._8_8_;
    TasDREAM::SampleDREAM<(TasDREAM::TypeSamplingForm)1>
              (num_burnup,num_collect,(DreamPDF *)probability_distribution,this,
               (TasmanianDREAM *)state_pntr,dist,iupdate_magnitude,differential_update_00,
               get_random01_00);
  }
  std::_Function_base::~_Function_base(&this_00->super__Function_base);
  std::_Function_base::~_Function_base((_Function_base *)independent_update);
  std::_Function_base::~_Function_base(&this->super__Function_base);
  std::_Function_base::~_Function_base((_Function_base *)probability_distribution);
  *err = 0;
  std::_Function_base::~_Function_base(&randgen.super__Function_base);
  std::__cxx11::string::~string((string *)&rtype);
  std::_Function_base::~_Function_base(&diff_update.super__Function_base);
  std::_Function_base::~_Function_base(&domain.super__Function_base);
  return;
}

Assistant:

void tsgDreamSample(int form,
                    int num_burnup, int num_collect,
                    tsg_dream_pdf distribution,
                    void* state_pntr,
                    void *domain_grid, double domain_lower[], double dommain_upper[], tsg_dream_domain domain_callback,
                    const char* iupdate_type, double iupdate_magnitude, tsg_dream_iupdate iupdate_callback,
                    int dupdate_percent, tsg_dream_dupdate dupdate_callback,
                    const char* random_type, int random_seed, tsg_dream_random random_callback, int *err){
    *err = 1;
    TasmanianDREAM& state = *reinterpret_cast<TasmanianDREAM*>(state_pntr);

    int num_dimensions = (int) state.getNumDimensions();

    auto domain = getSpecifiedDomain(num_dimensions, domain_grid, domain_lower, dommain_upper, domain_callback);

    TypeDistribution dist = IO::getDistributionString(iupdate_type);

    auto diff_update = getSpecifiedDifferentialUpdate(dupdate_percent, dupdate_callback);

    std::minstd_rand park_miller((random_seed == -1) ? static_cast<long unsigned>(std::time(nullptr)) : random_seed);
    std::uniform_real_distribution<double> unif(0.0, 1.0);
    srand((unsigned int) ((random_seed == -1) ? static_cast<long unsigned>(std::time(nullptr)) : random_seed));
    std::string rtype(random_type);

    auto randgen = [&]()->
    std::function<double(void)>{
        if (rtype == "default"){
            return [&]()->double{ return tsgCoreUniform01(); };
        }else if (rtype == "minstd_rand"){
            return [&]()->double{ return unif(park_miller); };
        }else{
            return [&]()->double{ return random_callback(); };
        }
    }();

    try{
        if (dist == dist_null){
            if (IO::intToForm(form) == regform){
                SampleDREAM<regform>(num_burnup, num_collect, [&](const std::vector<double> &candidates, std::vector<double> &values)->
                void{
                    int num_samples = (int) candidates.size() / num_dimensions;
                    int error_code = 0;
                    distribution(num_samples, num_dimensions, candidates.data(), values.data(), &error_code);
                    if (error_code != 0) throw std::runtime_error("The Python callback returned an error in tsgDreamSample()");
                }, domain, state, [&](std::vector<double> &x)->
                void{
                    int error_code = 0;
                    iupdate_callback((int) x.size(), x.data(), &error_code);
                    if (error_code != 0) throw std::runtime_error("The Python callback returned an error in tsgDreamSample()");
                }, diff_update, randgen);
            }else{
                SampleDREAM<logform>(num_burnup, num_collect, [&](const std::vector<double> &candidates, std::vector<double> &values)->
                void{
                    int num_samples = (int) candidates.size() / num_dimensions;
                    int error_code = 0;
                    distribution(num_samples, num_dimensions, candidates.data(), values.data(), &error_code);
                    if (error_code != 0) throw std::runtime_error("The Python callback returned an error in tsgDreamSample()");
                }, domain, state, [&](std::vector<double> &x)->
                void{
                    int error_code = 0;
                    iupdate_callback((int) x.size(), x.data(), &error_code);
                    if (error_code != 0) throw std::runtime_error("The Python callback returned an error in tsgDreamSample()");
                }, diff_update, randgen);
            }
        }else{
            if (IO::intToForm(form) == regform){
                SampleDREAM<regform>(num_burnup, num_collect, [&](const std::vector<double> &candidates, std::vector<double> &values)->
                void{
                    int num_samples = (int) candidates.size() / num_dimensions;
                    int error_code = 0;
                    distribution(num_samples, num_dimensions, candidates.data(), values.data(), &error_code);
                    if (error_code != 0) throw std::runtime_error("The Python callback returned an error in tsgDreamSample()");
                }, domain, state, dist, iupdate_magnitude, diff_update, randgen);
            }else{
                SampleDREAM<logform>(num_burnup, num_collect, [&](const std::vector<double> &candidates, std::vector<double> &values)->
                void{
                    int num_samples = (int) candidates.size() / num_dimensions;
                    int error_code = 0;
                    distribution(num_samples, num_dimensions, candidates.data(), values.data(), &error_code);
                    if (error_code != 0) throw std::runtime_error("The Python callback returned an error in analysis()");
                }, domain, state, dist, iupdate_magnitude, diff_update, randgen);
            }
        }
        *err = 0; // success
    }catch(std::runtime_error &){} // *err will remain 1
}